

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter_Geometry2D.cpp
# Opt level: O0

void __thiscall Assimp::X3DImporter::ParseNode_Geometry2D_Disk2D(X3DImporter *this)

{
  list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *plVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  pointer pFVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ulong uVar7;
  CX3DImporter_NodeElement_Geometry2D *pCVar8;
  size_type sVar9;
  DeadlyImportError *this_00;
  reference paVar10;
  allocator local_199;
  string local_198;
  _List_iterator<aiVector3t<float>_> local_178;
  _List_iterator<aiVector3t<float>_> local_170;
  _List_iterator<aiVector3t<float>_> local_168;
  _List_iterator<aiVector3t<float>_> local_160;
  _List_iterator<aiVector3t<float>_> local_158;
  _List_iterator<aiVector3t<float>_> local_150;
  _Self local_148;
  _List_iterator<aiVector3t<float>_> local_140;
  iterator it_o;
  iterator it_i;
  string local_128;
  list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *local_108;
  list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *vlist;
  string local_f8;
  undefined1 local_d8 [8];
  list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> tlist_i;
  list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> tlist_o;
  undefined1 local_a0 [8];
  string an;
  uint local_6c;
  int idx_end;
  int idx;
  CX3DImporter_NodeElement *ne;
  float local_58;
  float fStack_54;
  bool solid;
  float outerRadius;
  float innerRadius;
  string use;
  string def;
  X3DImporter *this_local;
  
  std::__cxx11::string::string((string *)(use.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&outerRadius);
  fStack_54 = 0.0;
  local_58 = 1.0;
  ne._7_1_ = 0;
  _idx_end = (CX3DImporter_NodeElement_Geometry2D *)0x0;
  local_6c = 0;
  pFVar6 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::operator->
                     (&this->mReader);
  iVar3 = (*(pFVar6->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[4])();
  for (; (int)local_6c < iVar3; local_6c = local_6c + 1) {
    pFVar6 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::operator->
                       (&this->mReader);
    iVar4 = (*(pFVar6->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[5])
                      (pFVar6,(ulong)local_6c);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)local_a0,(char *)CONCAT44(extraout_var,iVar4),
               (allocator *)
               ((long)&tlist_o.
                       super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                       _M_impl._M_node._M_size + 7));
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&tlist_o.
                       super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                       _M_impl._M_node._M_size + 7));
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_a0,"DEF");
    if (bVar2) {
      pFVar6 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::operator->
                         (&this->mReader);
      iVar4 = (*(pFVar6->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])
                        (pFVar6,(ulong)local_6c);
      std::__cxx11::string::operator=
                ((string *)(use.field_2._M_local_buf + 8),(char *)CONCAT44(extraout_var_00,iVar4));
      tlist_o.super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
      _M_node._M_size._0_4_ = 4;
    }
    else {
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_a0,"USE");
      if (bVar2) {
        pFVar6 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::
                 operator->(&this->mReader);
        iVar4 = (*(pFVar6->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])
                          (pFVar6,(ulong)local_6c);
        std::__cxx11::string::operator=
                  ((string *)&outerRadius,(char *)CONCAT44(extraout_var_01,iVar4));
        tlist_o.super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
        _M_node._M_size._0_4_ = 4;
      }
      else {
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_a0,"bboxCenter");
        if (bVar2) {
          tlist_o.super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
          _M_node._M_size._0_4_ = 4;
        }
        else {
          bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_a0,"bboxSize");
          if (bVar2) {
            tlist_o.super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
            ._M_node._M_size._0_4_ = 4;
          }
          else {
            bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_a0,"containerField");
            if (bVar2) {
              tlist_o.super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
              _M_impl._M_node._M_size._0_4_ = 4;
            }
            else {
              bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_a0,"innerRadius");
              if (bVar2) {
                fStack_54 = XML_ReadNode_GetAttrVal_AsFloat(this,local_6c);
                tlist_o.super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                _M_impl._M_node._M_size._0_4_ = 4;
              }
              else {
                bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_a0,"outerRadius");
                if (bVar2) {
                  local_58 = XML_ReadNode_GetAttrVal_AsFloat(this,local_6c);
                  tlist_o.super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                  _M_impl._M_node._M_size._0_4_ = 4;
                }
                else {
                  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)local_a0,"solid");
                  if (bVar2) {
                    ne._7_1_ = XML_ReadNode_GetAttrVal_AsBool(this,local_6c);
                    tlist_o.super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                    ._M_impl._M_node._M_size._0_4_ = 4;
                  }
                  else {
                    Throw_IncorrectAttr(this,(string *)local_a0);
                    tlist_o.super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                    ._M_impl._M_node._M_size._0_4_ = 0;
                  }
                }
              }
            }
          }
        }
      }
    }
    std::__cxx11::string::~string((string *)local_a0);
  }
  uVar7 = std::__cxx11::string::empty();
  if ((uVar7 & 1) == 0) {
    XML_CheckNode_MustBeEmpty(this);
    uVar7 = std::__cxx11::string::empty();
    if ((uVar7 & 1) == 0) {
      Throw_DEF_And_USE(this);
    }
    bVar2 = FindNodeElement(this,(string *)&outerRadius,ENET_Disk2D,
                            (CX3DImporter_NodeElement **)&idx_end);
    if (!bVar2) {
      Throw_USE_NotFound(this,(string *)&outerRadius);
    }
    std::__cxx11::list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>::
    push_back(&this->NodeElement_Cur->Child,(value_type *)&idx_end);
  }
  else {
    std::__cxx11::list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::list
              ((list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
               &tlist_i.super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                _M_impl._M_node._M_size);
    std::__cxx11::list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::list
              ((list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)local_d8);
    if (local_58 < fStack_54) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_f8,"innerRadius",(allocator *)((long)&vlist + 7));
      Throw_IncorrectAttrValue(this,&local_f8);
      std::__cxx11::string::~string((string *)&local_f8);
      std::allocator<char>::~allocator((allocator<char> *)((long)&vlist + 7));
    }
    pCVar8 = (CX3DImporter_NodeElement_Geometry2D *)operator_new(0x78);
    CX3DImporter_NodeElement_Geometry2D::CX3DImporter_NodeElement_Geometry2D
              (pCVar8,ENET_Disk2D,this->NodeElement_Cur);
    _idx_end = pCVar8;
    uVar7 = std::__cxx11::string::empty();
    if ((uVar7 & 1) == 0) {
      std::__cxx11::string::operator=
                ((string *)&(_idx_end->super_CX3DImporter_NodeElement).ID,
                 (string *)(use.field_2._M_local_buf + 8));
    }
    GeometryHelper_Make_Arc2D
              (this,0.0,0.0,local_58,10,
               (list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
               &tlist_i.super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                _M_impl._M_node._M_size);
    if ((fStack_54 != 0.0) || (NAN(fStack_54))) {
      if ((fStack_54 != local_58) || (NAN(fStack_54) || NAN(local_58))) {
        local_108 = &_idx_end->Vertices;
        GeometryHelper_Make_Arc2D
                  (this,0.0,0.0,fStack_54,10,
                   (list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)local_d8);
        sVar9 = std::__cxx11::list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                          ((list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)local_d8)
        ;
        if (sVar9 < 2) {
          it_i._M_node._6_1_ = 1;
          this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_128,"Disk2D. Not enough points for creating quad list.",
                     (allocator *)((long)&it_i._M_node + 7));
          DeadlyImportError::DeadlyImportError(this_00,&local_128);
          it_i._M_node._6_1_ = 0;
          __cxa_throw(this_00,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
        }
        it_o = std::__cxx11::list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::begin
                         ((list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)local_d8);
        local_140._M_node =
             (_List_node_base *)
             std::__cxx11::list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::begin
                       ((list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                        &tlist_i.
                         super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                         _M_impl._M_node._M_size);
        while( true ) {
          local_148._M_node =
               (_List_node_base *)
               std::__cxx11::list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::end
                         ((list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)local_d8);
          bVar2 = std::operator!=(&it_o,&local_148);
          plVar1 = local_108;
          if (!bVar2) break;
          local_150._M_node =
               (_List_node_base *)std::_List_iterator<aiVector3t<float>_>::operator++(&it_o,0);
          paVar10 = std::_List_iterator<aiVector3t<float>_>::operator*(&local_150);
          std::__cxx11::list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
                    (plVar1,paVar10);
          plVar1 = local_108;
          local_158._M_node =
               (_List_node_base *)std::_List_iterator<aiVector3t<float>_>::operator++(&local_140,0);
          paVar10 = std::_List_iterator<aiVector3t<float>_>::operator*(&local_158);
          std::__cxx11::list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
                    (plVar1,paVar10);
          plVar1 = local_108;
          paVar10 = std::_List_iterator<aiVector3t<float>_>::operator*(&local_140);
          std::__cxx11::list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
                    (plVar1,paVar10);
          plVar1 = local_108;
          paVar10 = std::_List_iterator<aiVector3t<float>_>::operator*(&it_o);
          std::__cxx11::list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
                    (plVar1,paVar10);
        }
        local_160._M_node =
             (_List_node_base *)
             std::__cxx11::list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::end
                       ((list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)local_d8);
        paVar10 = std::_List_iterator<aiVector3t<float>_>::operator*(&local_160);
        std::__cxx11::list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
                  (plVar1,paVar10);
        plVar1 = local_108;
        local_168._M_node =
             (_List_node_base *)
             std::__cxx11::list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::end
                       ((list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                        &tlist_i.
                         super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                         _M_impl._M_node._M_size);
        paVar10 = std::_List_iterator<aiVector3t<float>_>::operator*(&local_168);
        std::__cxx11::list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
                  (plVar1,paVar10);
        plVar1 = local_108;
        local_170._M_node =
             (_List_node_base *)
             std::__cxx11::list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::begin
                       ((list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                        &tlist_i.
                         super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                         _M_impl._M_node._M_size);
        paVar10 = std::_List_iterator<aiVector3t<float>_>::operator*(&local_170);
        std::__cxx11::list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
                  (plVar1,paVar10);
        plVar1 = local_108;
        local_178._M_node =
             (_List_node_base *)
             std::__cxx11::list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::begin
                       ((list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                        &tlist_i.
                         super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                         _M_impl._M_node._M_size);
        paVar10 = std::_List_iterator<aiVector3t<float>_>::operator*(&local_178);
        std::__cxx11::list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
                  (plVar1,paVar10);
        _idx_end->NumIndices = 4;
      }
      else {
        GeometryHelper_Extend_PointToLine
                  (this,(list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                        &tlist_i.
                         super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                         _M_impl._M_node._M_size,&_idx_end->Vertices);
        _idx_end->NumIndices = 2;
      }
    }
    else {
      std::__cxx11::list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::operator=
                (&_idx_end->Vertices,
                 (list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                 &tlist_i.super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                  _M_impl._M_node._M_size);
      sVar9 = std::__cxx11::list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                        ((list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                         &tlist_i.
                          super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                          _M_impl._M_node._M_size);
      _idx_end->NumIndices = sVar9;
    }
    _idx_end->Solid = (bool)(ne._7_1_ & 1);
    pFVar6 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::operator->
                       (&this->mReader);
    uVar5 = (*(pFVar6->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0xf])();
    pCVar8 = _idx_end;
    if ((uVar5 & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_198,"Disk2D",&local_199);
      ParseNode_Metadata(this,&pCVar8->super_CX3DImporter_NodeElement,&local_198);
      std::__cxx11::string::~string((string *)&local_198);
      std::allocator<char>::~allocator((allocator<char> *)&local_199);
    }
    else {
      std::__cxx11::list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>::
      push_back(&this->NodeElement_Cur->Child,(value_type *)&idx_end);
    }
    std::__cxx11::list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>::
    push_back(&this->NodeElement_List,(value_type *)&idx_end);
    std::__cxx11::list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::~list
              ((list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)local_d8);
    std::__cxx11::list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::~list
              ((list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
               &tlist_i.super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                _M_impl._M_node._M_size);
  }
  std::__cxx11::string::~string((string *)&outerRadius);
  std::__cxx11::string::~string((string *)(use.field_2._M_local_buf + 8));
  return;
}

Assistant:

void X3DImporter::ParseNode_Geometry2D_Disk2D()
{
    std::string def, use;
    float innerRadius = 0;
    float outerRadius = 1;
    bool solid = false;
    CX3DImporter_NodeElement* ne( nullptr );

	MACRO_ATTRREAD_LOOPBEG;
		MACRO_ATTRREAD_CHECKUSEDEF_RET(def, use);
		MACRO_ATTRREAD_CHECK_RET("innerRadius", innerRadius, XML_ReadNode_GetAttrVal_AsFloat);
		MACRO_ATTRREAD_CHECK_RET("outerRadius", outerRadius, XML_ReadNode_GetAttrVal_AsFloat);
		MACRO_ATTRREAD_CHECK_RET("solid", solid, XML_ReadNode_GetAttrVal_AsBool);
	MACRO_ATTRREAD_LOOPEND;

	// if "USE" defined then find already defined element.
	if(!use.empty())
	{
		MACRO_USE_CHECKANDAPPLY(def, use, ENET_Disk2D, ne);
	}
	else
	{
		std::list<aiVector3D> tlist_o, tlist_i;

		if(innerRadius > outerRadius) Throw_IncorrectAttrValue("innerRadius");

		// create and if needed - define new geometry object.
		ne = new CX3DImporter_NodeElement_Geometry2D(CX3DImporter_NodeElement::ENET_Disk2D, NodeElement_Cur);
		if(!def.empty()) ne->ID = def;

		// create point list of geometry object.
		///TODO: IME - AI_CONFIG for NumSeg
		GeometryHelper_Make_Arc2D(0, 0, outerRadius, 10, tlist_o);// outer circle
		if(innerRadius == 0.0f)
		{// make filled disk
			// in tlist_o we already have points of circle. just copy it and sign as polygon.
			((CX3DImporter_NodeElement_Geometry2D*)ne)->Vertices = tlist_o;
			((CX3DImporter_NodeElement_Geometry2D*)ne)->NumIndices = tlist_o.size();
		}
		else if(innerRadius == outerRadius)
		{// make circle
			// in tlist_o we already have points of circle. convert it to line set.
			GeometryHelper_Extend_PointToLine(tlist_o, ((CX3DImporter_NodeElement_Geometry2D*)ne)->Vertices);
			((CX3DImporter_NodeElement_Geometry2D*)ne)->NumIndices = 2;
		}
		else
		{// make disk
			std::list<aiVector3D>& vlist = ((CX3DImporter_NodeElement_Geometry2D*)ne)->Vertices;// just short alias.

			GeometryHelper_Make_Arc2D(0, 0, innerRadius, 10, tlist_i);// inner circle
			//
			// create quad list from two point lists
			//
			if(tlist_i.size() < 2) throw DeadlyImportError("Disk2D. Not enough points for creating quad list.");// tlist_i and tlist_o has equal size.

			// add all quads except last
			for(std::list<aiVector3D>::iterator it_i = tlist_i.begin(), it_o = tlist_o.begin(); it_i != tlist_i.end();)
			{
				// do not forget - CCW direction
				vlist.push_back(*it_i++);// 1st point
				vlist.push_back(*it_o++);// 2nd point
				vlist.push_back(*it_o);// 3rd point
				vlist.push_back(*it_i);// 4th point
			}

			// add last quad
			vlist.push_back(*tlist_i.end());// 1st point
			vlist.push_back(*tlist_o.end());// 2nd point
			vlist.push_back(*tlist_o.begin());// 3rd point
			vlist.push_back(*tlist_o.begin());// 4th point

			((CX3DImporter_NodeElement_Geometry2D*)ne)->NumIndices = 4;
		}

		((CX3DImporter_NodeElement_Geometry2D*)ne)->Solid = solid;
		// check for X3DMetadataObject childs.
		if(!mReader->isEmptyElement())
			ParseNode_Metadata(ne, "Disk2D");
		else
			NodeElement_Cur->Child.push_back(ne);// add made object as child to current element

		NodeElement_List.push_back(ne);// add element to node element list because its a new object in graph
	}// if(!use.empty()) else
}